

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppc.c
# Opt level: O1

int ppc_dcr_init_ppc(CPUPPCState_conflict *env,_func_int_int *read_error,_func_int_int *write_error)

{
  ppc_dcr_t *ppVar1;
  
  ppVar1 = (ppc_dcr_t *)g_malloc0(0x6010);
  ppVar1->read_error = read_error;
  ppVar1->write_error = write_error;
  env->dcr_env = ppVar1;
  return 0;
}

Assistant:

int ppc_dcr_init (CPUPPCState *env, int (*read_error)(int dcrn),
                  int (*write_error)(int dcrn))
{
    ppc_dcr_t *dcr_env;

    dcr_env = g_malloc0(sizeof(ppc_dcr_t));
    dcr_env->read_error = read_error;
    dcr_env->write_error = write_error;
    env->dcr_env = dcr_env;

    return 0;
}